

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

undefined8 __thiscall
despot::BaseTag::MostLikelyRobPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppSVar5;
  const_reference pvVar6;
  reference pvVar7;
  undefined8 uVar8;
  int local_50;
  int i_1;
  int id;
  TagState *tagstate;
  int i;
  int rob;
  double maxWeight;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_20;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  BaseTag *this_local;
  
  local_20 = particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  if (MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)::probs
      == '\0') {
    iVar3 = __cxa_guard_acquire(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                 ::probs);
    if (iVar3 != 0) {
      iVar3 = despot::Floor::NumCells();
      std::allocator<double>::allocator((allocator<double> *)((long)&maxWeight + 3));
      std::vector<double,_std::allocator<double>_>::vector
                (&MostLikelyRobPosition::probs,(long)iVar3,
                 (allocator<double> *)((long)&maxWeight + 3));
      std::allocator<double>::~allocator((allocator<double> *)((long)&maxWeight + 3));
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                   &MostLikelyRobPosition::probs,&__dso_handle);
      __cxa_guard_release(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                           ::probs);
    }
  }
  _i = 0.0;
  tagstate._0_4_ = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(local_20);
    if (sVar4 <= (ulong)(long)(int)tagstate) break;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (local_20,(long)(int)tagstate);
    pSVar2 = *ppSVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->rob_,(long)*(int *)(pSVar2 + 0xc));
    iVar3 = *pvVar6;
    dVar1 = *(double *)(pSVar2 + 0x18);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyRobPosition::probs,(long)iVar3);
    *pvVar7 = dVar1 + *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyRobPosition::probs,(long)iVar3);
    if (_i < *pvVar7) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&MostLikelyRobPosition::probs,(long)iVar3);
      _i = *pvVar7;
    }
    tagstate._0_4_ = (int)tagstate + 1;
  }
  local_50 = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&MostLikelyRobPosition::probs);
    if (sVar4 <= (ulong)(long)local_50) break;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&MostLikelyRobPosition::probs,(long)local_50);
    *pvVar7 = 0.0;
    local_50 = local_50 + 1;
  }
  uVar8 = despot::Floor::GetCell((int)this + 0x58);
  return uVar8;
}

Assistant:

Coord BaseTag::MostLikelyRobPosition(const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	double maxWeight = 0;
	int rob = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = rob_[tagstate->state_id];
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			rob = id;
		}
	}

	for (int i = 0; i < probs.size(); i++) {
		probs[i] = 0.0;
	}

	return floor_.GetCell(rob);
}